

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O1

wostream * Centaurus::operator<<(wostream *os,ATNPath *path)

{
  bool bVar1;
  pointer ppVar2;
  wostream *pwVar3;
  ulong uVar4;
  pointer ppVar5;
  ulong uVar6;
  wchar_t local_3c [3];
  
  if ((path->
      super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ).
      super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (path->
      super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ).
      super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar2 = (path->
             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             ).
             super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (path->
             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             ).
             super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)ppVar5 - (long)ppVar2 != 0x30) {
      uVar4 = 0;
      uVar6 = 1;
      do {
        pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (os,ppVar2[uVar4].first.m_id._M_dataplus._M_p,
                            ppVar2[uVar4].first.m_id._M_string_length);
        local_3c[0] = L'.';
        pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,local_3c,1);
        pwVar3 = (wostream *)
                 std::wostream::operator<<
                           ((wostream *)pwVar3,
                            (path->
                            super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                            ).
                            super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar4].second);
        local_3c[1] = 0x2f;
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,local_3c + 1,1);
        ppVar2 = (path->
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ).
                 super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar5 = (path->
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ).
                 super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar1 = uVar6 < ((long)ppVar5 - (long)ppVar2 >> 4) * -0x5555555555555555 - 1U;
        uVar4 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar1);
    }
    pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (os,ppVar5[-1].first.m_id._M_dataplus._M_p,
                        ppVar5[-1].first.m_id._M_string_length);
    local_3c[2] = 0x2e;
    pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,local_3c + 2,1);
    std::wostream::operator<<
              ((wostream *)pwVar3,
               (path->
               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ).
               super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].second);
  }
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const ATNPath& path)
{
	if (!path.empty())
	{
		for (unsigned int i = 0; i < path.size() - 1; i++)
		{
			os << path[i].first << L'.' << path[i].second << L'/';
		}
		os << path.back().first << L'.' << path.back().second;
	}
	return os;
}